

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moving_sphere.h
# Opt level: O0

bool __thiscall
moving_sphere::hit(moving_sphere *this,ray *r,double t_min,double t_max,hit_record *rec)

{
  vec3 v;
  vec3 v_00;
  double dVar1;
  ray *prVar2;
  double time;
  double dVar3;
  double dVar4;
  double time_00;
  double time_01;
  vec3 local_1a0;
  vec3 local_188;
  undefined1 local_170 [8];
  vec3 outward_normal_1;
  undefined8 local_150;
  undefined8 local_148;
  vec3 local_140;
  vec3 local_128;
  undefined1 local_110 [8];
  vec3 outward_normal;
  undefined8 local_f0;
  undefined8 local_e8;
  double temp;
  double root;
  double discriminant;
  double c;
  double local_a8;
  double half_b;
  double local_88;
  double a;
  vec3 local_68;
  undefined1 local_50 [8];
  vec3 oc;
  hit_record *rec_local;
  double t_max_local;
  double t_min_local;
  ray *r_local;
  moving_sphere *this_local;
  
  prVar2 = r;
  oc.e[2] = (double)rec;
  ray::origin(&local_68,r);
  ray::time(r,(time_t *)prVar2);
  center((vec3 *)&a,this,time);
  operator-((vec3 *)local_50,&local_68,(vec3 *)&a);
  ray::direction((vec3 *)&half_b,r);
  local_88 = vec3::length_squared((vec3 *)&half_b);
  ray::direction((vec3 *)&c,r);
  local_a8 = dot((vec3 *)local_50,(vec3 *)&c);
  dVar3 = vec3::length_squared((vec3 *)local_50);
  dVar3 = local_a8 * local_a8 + -(local_88 * (-this->radius * this->radius + dVar3));
  if (0.0 < dVar3) {
    dVar4 = sqrt(dVar3);
    dVar1 = -local_a8;
    dVar3 = sqrt(dVar3);
    dVar3 = (dVar1 - dVar3) / local_88;
    if ((dVar3 < t_max) && (t_min < dVar3)) {
      *(double *)((long)oc.e[2] + 0x40) = dVar3;
      prVar2 = r;
      ray::at((vec3 *)(outward_normal.e + 2),r,*(double *)((long)oc.e[2] + 0x40));
      dVar3 = oc.e[2];
      *(double *)oc.e[2] = outward_normal.e[2];
      *(undefined8 *)((long)oc.e[2] + 8) = local_f0;
      *(undefined8 *)((long)oc.e[2] + 0x10) = local_e8;
      ray::time(r,(time_t *)prVar2);
      center(&local_140,this,time_00);
      operator-(&local_128,(vec3 *)dVar3,&local_140);
      v.e[1] = local_128.e[1];
      v.e[0] = local_128.e[0];
      v.e[2] = local_128.e[2];
      operator/((vec3 *)local_110,v,this->radius);
      hit_record::set_face_normal((hit_record *)oc.e[2],r,(vec3 *)local_110);
      std::shared_ptr<material>::operator=
                ((shared_ptr<material> *)((long)oc.e[2] + 0x30),&this->mat_ptr);
      return true;
    }
    dVar3 = (-local_a8 + dVar4) / local_88;
    if ((dVar3 < t_max) && (t_min < dVar3)) {
      *(double *)((long)oc.e[2] + 0x40) = dVar3;
      prVar2 = r;
      ray::at((vec3 *)(outward_normal_1.e + 2),r,*(double *)((long)oc.e[2] + 0x40));
      dVar3 = oc.e[2];
      *(double *)oc.e[2] = outward_normal_1.e[2];
      *(undefined8 *)((long)oc.e[2] + 8) = local_150;
      *(undefined8 *)((long)oc.e[2] + 0x10) = local_148;
      ray::time(r,(time_t *)prVar2);
      center(&local_1a0,this,time_01);
      operator-(&local_188,(vec3 *)dVar3,&local_1a0);
      v_00.e[1] = local_188.e[1];
      v_00.e[0] = local_188.e[0];
      v_00.e[2] = local_188.e[2];
      operator/((vec3 *)local_170,v_00,this->radius);
      hit_record::set_face_normal((hit_record *)oc.e[2],r,(vec3 *)local_170);
      std::shared_ptr<material>::operator=
                ((shared_ptr<material> *)((long)oc.e[2] + 0x30),&this->mat_ptr);
      return true;
    }
  }
  return false;
}

Assistant:

bool moving_sphere::hit(const ray& r, double t_min, double t_max, hit_record& rec) const{
    vec3 oc = r.origin() - center(r.time());
    auto a = r.direction().length_squared();
    auto half_b = dot(oc,r.direction());
    auto c = oc.length_squared() - radius * radius;
    auto discriminant = half_b * half_b - a * c;

    if (discriminant > 0) {
        auto root = sqrt(discriminant);
        auto temp = (-half_b - sqrt(discriminant)) / a;
        if (temp < t_max && temp > t_min){
            rec.t = temp;
            rec.p = r.at(rec.t);
            vec3 outward_normal = (rec.p - center(r.time())) / radius;
            rec.set_face_normal(r,outward_normal);
            rec.mat_ptr = mat_ptr;
            return true;
        }

        temp = (-half_b + root) / a;
        if (temp < t_max && temp > t_min){
            rec.t = temp;
            rec.p = r.at(rec.t);
            vec3 outward_normal = (rec.p - center(r.time())) / radius;
            rec.set_face_normal(r,outward_normal);
            rec.mat_ptr = mat_ptr;
            return true;
        }
    }

    return false;
}